

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::valtype<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined8 *puVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  bool bVar4;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  string_view expected_09;
  string_view expected_10;
  string_view expected_11;
  string_view expected_12;
  string local_d8;
  string local_b8;
  undefined1 local_98 [8];
  Result<wasm::WATParser::Ok> type_1;
  MaybeResult<wasm::WATParser::Ok> type;
  Result<wasm::WATParser::Ok> _val;
  
  expected._M_str = "i32";
  expected._M_len = 3;
  bVar4 = ParseInput::takeKeyword(&ctx->in,expected);
  if ((((!bVar4) &&
       (expected_00._M_str = "i64", expected_00._M_len = 3,
       bVar4 = ParseInput::takeKeyword(&ctx->in,expected_00), !bVar4)) &&
      (expected_01._M_str = "f32", expected_01._M_len = 3,
      bVar4 = ParseInput::takeKeyword(&ctx->in,expected_01), !bVar4)) &&
     ((expected_02._M_str = "f64", expected_02._M_len = 3,
      bVar4 = ParseInput::takeKeyword(&ctx->in,expected_02), !bVar4 &&
      (expected_03._M_str = "v128", expected_03._M_len = 4,
      bVar4 = ParseInput::takeKeyword(&ctx->in,expected_03), !bVar4)))) {
    expected_04._M_str = "funcref";
    expected_04._M_len = 7;
    bVar4 = ParseInput::takeKeyword(&ctx->in,expected_04);
    if ((((bVar4) ||
         ((expected_05._M_str = "externref", expected_05._M_len = 9,
          bVar4 = ParseInput::takeKeyword(&ctx->in,expected_05), bVar4 ||
          (expected_06._M_str = "anyref", expected_06._M_len = 6,
          bVar4 = ParseInput::takeKeyword(&ctx->in,expected_06), bVar4)))) ||
        (expected_07._M_str = "eqref", expected_07._M_len = 5,
        bVar4 = ParseInput::takeKeyword(&ctx->in,expected_07), bVar4)) ||
       ((expected_08._M_str = "i31ref", expected_08._M_len = 6,
        bVar4 = ParseInput::takeKeyword(&ctx->in,expected_08), bVar4 ||
        (expected_09._M_str = "structref", expected_09._M_len = 9,
        bVar4 = ParseInput::takeKeyword(&ctx->in,expected_09), bVar4)))) {
      type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
      .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
      ._M_u._24_1_ = 0;
    }
    else {
      expected_10._M_str = "arrayref";
      expected_10._M_len = 8;
      bVar4 = ParseInput::takeKeyword(&ctx->in,expected_10);
      if (bVar4) {
        puVar3 = (undefined1 *)
                 ((long)&_val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8);
        type.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._32_8_ = puVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   ((long)&type.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20),"arrayref not yet supported","");
        ParseInput::err((Err *)local_98,&ctx->in,
                        (string *)
                        ((long)&type.val.
                                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        + 0x20));
        type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_ =
             (long)&type.val.
                    super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             + 8;
        pcVar2 = (pointer)((long)&type_1.val.
                                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                  .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                  .super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                          + 8);
        if (local_98 == (undefined1  [8])pcVar2) {
          type.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._16_8_ = type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         _M_u._16_8_;
        }
        else {
          type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_ = local_98;
        }
        type.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._M_u._0_8_ = type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u.
                      _0_8_;
        type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._0_8_ = 0;
        type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._8_1_ = 0;
        type.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._M_u._24_1_ = 2;
        local_98 = (undefined1  [8])pcVar2;
        if ((undefined1 *)
            type.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._32_8_ != puVar3) {
          operator_delete((void *)type.val.
                                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  ._32_8_,
                          CONCAT71(_val.val.
                                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   ._M_u._9_7_,
                                   _val.val.
                                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   ._M_u._8_1_) + 1);
        }
      }
      else {
        expected_11._M_str = "ref";
        expected_11._M_len = 3;
        bVar4 = ParseInput::takeSExprStart(&ctx->in,expected_11);
        if (bVar4) {
          expected_12._M_str = "null";
          expected_12._M_len = 4;
          ParseInput::takeKeyword(&ctx->in,expected_12);
          heaptype<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                    ((Result<wasm::WATParser::Ok> *)local_98,ctx);
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::_Copy_ctor_base
                    ((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                     ((long)&type.val.
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     + 0x20),(_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                             local_98);
          if (_val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ ==
              '\x01') {
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,
                       type.val.
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       ._32_8_,_val.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                               ._M_u._0_8_ +
                               type.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               ._32_8_);
            type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_ =
                 (long)&type.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
              type.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._M_u._16_8_ = local_b8.field_2._8_8_;
            }
            else {
              type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_ =
                   local_b8._M_dataplus._M_p;
            }
            type.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._0_8_ = local_b8._M_string_length;
            type.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._24_1_ = 2;
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::~_Variant_storage
                      ((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                       ((long)&type.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       + 0x20));
          }
          else {
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::~_Variant_storage
                      ((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                       ((long)&type.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       + 0x20));
            bVar4 = ParseInput::takeRParen(&ctx->in);
            if (bVar4) {
              type.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._M_u._24_1_ = 0;
            }
            else {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b8,"expected end of reftype","");
              ParseInput::err((Err *)((long)&type.val.
                                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     + 0x20),&ctx->in,&local_b8);
              type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_ =
                   (long)&type.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 8;
              puVar3 = (undefined1 *)
                       ((long)&_val.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8
                       );
              if ((undefined1 *)
                  type.val.
                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  ._32_8_ == puVar3) {
                type.val.
                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                ._M_u._16_8_ = _val.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                               ._M_u._16_8_;
              }
              else {
                type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_index =
                     type.val.
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     ._M_index;
                type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._33_7_ =
                     type.val.
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     ._33_7_;
              }
              type.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._M_u._0_8_ = _val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            _M_u._0_8_;
              _val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._0_8_ = 0
              ;
              _val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._8_1_ = 0
              ;
              type.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._M_u._24_1_ = 2;
              type.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._32_8_ = puVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_98)
          ;
        }
        else {
          type.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._24_1_ = 1;
        }
      }
    }
    if (type.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._M_u._24_1_ == '\x01') {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"expected valtype","");
      ParseInput::err((Err *)local_98,&ctx->in,&local_d8);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
               0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
        .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
      pcVar2 = (pointer)((long)&type_1.val.
                                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                        8);
      if (local_98 == (undefined1  [8])pcVar2) {
        *puVar1 = CONCAT71(type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                           .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           _M_u._9_7_,
                           type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                           .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           _M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18) =
             type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = local_98;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                  0x10) =
             CONCAT71(type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u.
                      _9_7_,type_1.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            _M_u._8_1_);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
           type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._0_8_;
      type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._0_8_ = 0;
      type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
           '\x01';
      local_98 = (undefined1  [8])pcVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)local_98,
                      (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)((long)&type_1.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                         0x20));
      if (type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ ==
          '\x02') {
        puVar3 = (undefined1 *)
                 ((long)&_val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8);
        type.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._32_8_ = puVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&type.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20),local_98,
                   (pointer)(type_1.val.
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                             ._M_u._0_8_ + (long)local_98));
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
        if ((undefined1 *)
            type.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._32_8_ == puVar3) {
          *puVar1 = CONCAT71(_val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                             .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                             ._M_u._9_7_,
                             _val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                             .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                             ._M_u._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18) =
               _val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._16_8_;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
               type.val.
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               ._32_8_;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                    + 0x10) =
               CONCAT71(_val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u
                        ._9_7_,_val.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                               ._M_u._8_1_);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
             _val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._0_8_;
        _val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._0_8_ = 0;
        _val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
             '\x01';
        type.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._32_8_ = puVar3;
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)local_98);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)local_98);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
             '\0';
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)((long)&type_1.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                         0x20));
    return __return_storage_ptr__;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> valtype(Ctx& ctx) {
  if (ctx.in.takeKeyword("i32"sv)) {
    return ctx.makeI32();
  } else if (ctx.in.takeKeyword("i64"sv)) {
    return ctx.makeI64();
  } else if (ctx.in.takeKeyword("f32"sv)) {
    return ctx.makeF32();
  } else if (ctx.in.takeKeyword("f64"sv)) {
    return ctx.makeF64();
  } else if (ctx.in.takeKeyword("v128"sv)) {
    return ctx.makeV128();
  } else if (auto type = reftype(ctx)) {
    CHECK_ERR(type);
    return *type;
  } else {
    return ctx.in.err("expected valtype");
  }
}